

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType::SerializeWithCachedSizes
          (ArrayFeatureType *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  ArrayFeatureType_ArrayDataType AVar3;
  int32 value;
  int64 value_00;
  float value_01;
  double value_02;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ArrayFeatureType *this_local;
  
  iVar2 = shape_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_shape_cached_byte_size_);
  }
  local_20 = 0;
  iVar2 = shape_size(this);
  for (; local_20 < iVar2; local_20 = local_20 + 1) {
    value_00 = shape(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteInt64NoTag(value_00,output);
  }
  AVar3 = datatype(this);
  if (AVar3 != ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
    AVar3 = datatype(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(2,AVar3,output);
  }
  bVar1 = has_enumeratedshapes(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&((this->ShapeFlexibility_).enumeratedshapes_)->super_MessageLite,output);
  }
  bVar1 = has_shaperange(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&((this->ShapeFlexibility_).enumeratedshapes_)->super_MessageLite,output);
  }
  bVar1 = has_intdefaultvalue(this);
  if (bVar1) {
    value = intdefaultvalue(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x29,value,output);
  }
  bVar1 = has_floatdefaultvalue(this);
  if (bVar1) {
    value_01 = floatdefaultvalue(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x33,value_01,output);
  }
  bVar1 = has_doubledefaultvalue(this);
  if (bVar1) {
    value_02 = doubledefaultvalue(this);
    google::protobuf::internal::WireFormatLite::WriteDouble(0x3d,value_02,output);
  }
  return;
}

Assistant:

void ArrayFeatureType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ArrayFeatureType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 shape = 1;
  if (this->shape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shape_cached_byte_size_);
  }
  for (int i = 0, n = this->shape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->shape(i), output);
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->datatype() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      2, this->datatype(), output);
  }

  // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
  if (has_enumeratedshapes()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *ShapeFlexibility_.enumeratedshapes_, output);
  }

  // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
  if (has_shaperange()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *ShapeFlexibility_.shaperange_, output);
  }

  // int32 intDefaultValue = 41;
  if (has_intdefaultvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(41, this->intdefaultvalue(), output);
  }

  // float floatDefaultValue = 51;
  if (has_floatdefaultvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(51, this->floatdefaultvalue(), output);
  }

  // double doubleDefaultValue = 61;
  if (has_doubledefaultvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(61, this->doubledefaultvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ArrayFeatureType)
}